

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pwm.c
# Opt level: O1

mraa_result_t mraa_pwm_unexport_force(mraa_pwm_context dev)

{
  uint uVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *pcVar5;
  mraa_result_t mVar6;
  char out [64];
  char filepath [64];
  char acStack_a8 [64];
  char local_68 [72];
  
  mVar6 = MRAA_SUCCESS;
  snprintf(local_68,0x40,"/sys/class/pwm/pwmchip%d/unexport",(ulong)(uint)dev->chipid);
  __fd = open(local_68,1);
  if (__fd == -1) {
    uVar1 = dev->pin;
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    syslog(3,"pwm_unexport: pwm%i: Failed to open unexport for writing: %s",(ulong)uVar1,pcVar5);
    mVar6 = MRAA_ERROR_INVALID_RESOURCE;
  }
  else {
    iVar2 = snprintf(acStack_a8,0x40,"%d",(ulong)(uint)dev->pin);
    sVar3 = write(__fd,acStack_a8,(long)iVar2);
    if (sVar3 == -1) {
      uVar1 = dev->pin;
      piVar4 = __errno_location();
      pcVar5 = strerror(*piVar4);
      syslog(3,"pwm_unexport: pwm%i: Failed to write to unexport: %s",(ulong)uVar1,pcVar5);
      mVar6 = MRAA_ERROR_UNSPECIFIED;
    }
    close(__fd);
  }
  return mVar6;
}

Assistant:

mraa_result_t
mraa_pwm_unexport_force(mraa_pwm_context dev)
{
    char filepath[MAX_SIZE];
    snprintf(filepath, MAX_SIZE, "/sys/class/pwm/pwmchip%d/unexport", dev->chipid);

    int unexport_f = open(filepath, O_WRONLY);
    if (unexport_f == -1) {
        syslog(LOG_ERR, "pwm_unexport: pwm%i: Failed to open unexport for writing: %s", dev->pin, strerror(errno));
        return MRAA_ERROR_INVALID_RESOURCE;
    }

    char out[MAX_SIZE];
    int size = snprintf(out, MAX_SIZE, "%d", dev->pin);
    if (write(unexport_f, out, size * sizeof(char)) == -1) {
        syslog(LOG_ERR, "pwm_unexport: pwm%i: Failed to write to unexport: %s", dev->pin, strerror(errno));
        close(unexport_f);
        return MRAA_ERROR_UNSPECIFIED;
    }

    close(unexport_f);
    return MRAA_SUCCESS;
}